

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findCliqueHeu.cpp
# Opt level: O3

int maxCliqueHeu(CGraphIO *gio)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int j;
  ulong uVar14;
  vector<int,_std::allocator<int>_> v_i_S1;
  vector<int,_std::allocator<int>_> v_i_S;
  value_type_conflict local_94;
  CGraphIO *local_90;
  vector<int,_std::allocator<int>_> local_88;
  long local_70;
  long local_68;
  pointer local_60;
  ulong local_58;
  pointer local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  maxDegree = gio->m_i_MaximumVertexDegree;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_94 = 0;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)maxDegree + 1,&local_94);
  local_94 = 0;
  std::vector<int,_std::allocator<int>_>::resize(&local_88,(long)maxDegree + 1,&local_94);
  piVar5 = (gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = ((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5 >> 2) + -1;
  if (lVar10 == 0) {
    uVar7 = 0xffffffff;
  }
  else {
    local_60 = (gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar7 = 0xffffffff;
    lVar8 = 0;
    do {
      lVar1 = lVar8 + 1;
      if ((int)uVar7 <= piVar5[lVar8 + 1] - piVar5[lVar8]) {
        *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)lVar8;
        iVar2 = piVar5[lVar1];
        lVar13 = (long)piVar5[lVar8];
        uVar11 = 1;
        if (piVar5[lVar8] < iVar2) {
          do {
            iVar3 = local_60[lVar13];
            if ((int)uVar7 <= piVar5[(long)iVar3 + 1] - piVar5[iVar3]) {
              lVar8 = (long)(int)uVar11;
              uVar11 = uVar11 + 1;
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar8] = iVar3;
            }
            lVar13 = lVar13 + 1;
          } while (iVar2 != lVar13);
          if (0 < (int)uVar11) goto LAB_001642ea;
          uVar12 = 0;
        }
        else {
LAB_001642ea:
          uVar9 = 0;
          do {
            local_58 = uVar9;
            uVar9 = (ulong)uVar11;
            iVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9 - 1];
            piVar6 = (gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_50 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            uVar14 = 0;
            uVar11 = 0;
            do {
              iVar3 = piVar5[iVar2];
              if (iVar3 < piVar5[(long)iVar2 + 1]) {
                iVar4 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14];
                lVar8 = 0;
                do {
                  if ((iVar4 == piVar6[iVar3 + lVar8]) &&
                     ((int)uVar7 <= piVar5[(long)iVar4 + 1] - piVar5[iVar4])) {
                    lVar8 = (long)(int)uVar11;
                    uVar11 = uVar11 + 1;
                    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8] = iVar4;
                    break;
                  }
                  lVar8 = lVar8 + 1;
                } while (piVar5[(long)iVar2 + 1] - iVar3 != (int)lVar8);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar9);
            uVar12 = (int)local_58 + 1;
            if ((int)uVar11 < 1) break;
            uVar9 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar9] =
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
            uVar9 = (ulong)uVar12;
          } while (0 < (int)uVar11);
        }
        local_68 = lVar1;
        if ((int)uVar7 <= (int)uVar12) {
          uVar7 = uVar12;
        }
      }
      lVar8 = lVar1;
      local_90 = gio;
      local_70 = lVar10;
    } while (lVar1 != lVar10);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar7;
}

Assistant:

int maxCliqueHeu(CGraphIO& gio)
{
	vector <int>* p_v_i_Vertices = gio.GetVerticesPtr();
	vector <int>* p_v_i_Edges = gio.GetEdgesPtr();

	//srand(time(NULL));

	maxDegree = gio.GetMaximumVertexDegree();
	int maxClq = - 1, u, icc;
	vector < int > v_i_S;
	vector < int > v_i_S1;
	v_i_S.resize(maxDegree + 1, 0);
	v_i_S1.resize(maxDegree + 1, 0);

	int iPos, iPos1, iCount, iCount1;

	int notComputed = 0;

	// compute the max clique for each vertex
	for(int iCandidateVertex = 0; iCandidateVertex < p_v_i_Vertices->size() - 1; iCandidateVertex++)
	{
		// Pruning 1
		if(maxClq > ((*p_v_i_Vertices)[iCandidateVertex + 1] - (*p_v_i_Vertices)[iCandidateVertex]))
		{
			notComputed++;
			continue;
		}
		
		iPos = 0;		
		v_i_S[iPos++] = iCandidateVertex;
		int z, imdv = iCandidateVertex, imd = (*p_v_i_Vertices)[iCandidateVertex + 1] - (*p_v_i_Vertices)[iCandidateVertex];

		int iLoopCount = (*p_v_i_Vertices)[iCandidateVertex + 1];
		for(int j = (*p_v_i_Vertices)[iCandidateVertex]; j < iLoopCount; j++)
		{
			// Pruning 3
			if(maxClq <= ((*p_v_i_Vertices)[(*p_v_i_Edges)[j] + 1] - (*p_v_i_Vertices)[(*p_v_i_Edges)[j]]))
				v_i_S[iPos++] = (*p_v_i_Edges)[j];
		}

		icc = 0;
		
		while(iPos > 0)
		{
			int imdv1 = -1, imd1 = -1;

			icc++;

			// generate a random number x from 0 to iPos -1
			// aasign that imdv = x and imd = d(x)
			//imdv = v_i_S[rand() % iPos];
			imdv = v_i_S[iPos-1];
			imd = (*p_v_i_Vertices)[imdv + 1] - (*p_v_i_Vertices)[imdv];

			iPos1 = 0;

			for(int j = 0; j < iPos; j++)
			{
				iLoopCount = (*p_v_i_Vertices)[imdv + 1];
				for(int k = (*p_v_i_Vertices)[imdv]; k < iLoopCount; k++)
				{
					// Pruning 5
					if(v_i_S[j] == (*p_v_i_Edges)[k] && maxClq <= ((*p_v_i_Vertices)[(*p_v_i_Edges)[k] + 1] - (*p_v_i_Vertices)[(*p_v_i_Edges)[k]]))
					{
						v_i_S1[iPos1++] = v_i_S[j]; // calculate the max degree vertex here
						
						break;
					}
				}
			}

			for(int j = 0; j < iPos1; j++)
				v_i_S[j] = v_i_S1[j];
			
			iPos = iPos1;

			imdv = imdv1;
			imd = imd1;			
		}
	
		if(maxClq < icc)
			maxClq = icc;
			
	}

	return maxClq;
}